

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall person::operator==(person *this,person *rhs)

{
  bool bVar1;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  local_20;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  local_10;
  
  local_10.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .super__Tuple_impl<1UL,_const_int_&>.super__Head_base<1UL,_const_int_&,_false>._M_head_impl =
       (_Head_base<1UL,_const_int_&,_false>)&this->age;
  local_20.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .super__Tuple_impl<1UL,_const_int_&>.super__Head_base<1UL,_const_int_&,_false>._M_head_impl =
       (_Head_base<1UL,_const_int_&,_false>)&rhs->age;
  local_20.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl = &rhs->name;
  local_10.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl = &this->name;
  bVar1 = std::
          __tuple_compare<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>,_0UL,_2UL>
          ::__eq(&local_10,&local_20);
  return bVar1;
}

Assistant:

bool operator==(person const& rhs) const noexcept {
        return as_tuple(*this) == as_tuple(rhs);
    }